

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

TRef crec_arith_int64(jit_State *J,TRef *sp,CType **s,MMS mm)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  ushort uVar6;
  IRType st;
  IROp op;
  MSize i;
  TRef tr;
  CTypeID id;
  IRType dt;
  MMS mm_local;
  CType **s_local;
  TRef *sp_local;
  jit_State *J_local;
  
  if ((((*sp == 0) || (sp[1] == 0)) || ((*s)->info >> 0x1c != 0)) || (s[1]->info >> 0x1c != 0)) {
    return 0;
  }
  if (((((*s)->info & 0x800000) == 0) || ((*s)->size != 8)) &&
     (((s[1]->info & 0x800000) == 0 || (s[1]->size != 8)))) {
    tr = 0x15;
    i = 0xb;
    if (((mm < MM_add) && ((((*s)->info | s[1]->info) & 0x4000000) == 0)) &&
       (((*s)->size == 4 && (s[1]->size == 4)))) {
      if (((((*s)->info ^ s[1]->info) & 0x800000) == 0) ||
         (((sp[1] & 0xffff) < 0x8000 && (-1 < (J->cur).ir[sp[1] & 0xffff].i)))) {
        tr = 0x13;
        if (((*s)->info & 0x800000) != 0) {
          tr = 0x14;
        }
        goto LAB_001b70fb;
      }
      if (((*sp & 0xffff) < 0x8000) && (-1 < (J->cur).ir[*sp & 0xffff].i)) {
        tr = 0x13;
        if ((s[1]->info & 0x800000) != 0) {
          tr = 0x14;
        }
        goto LAB_001b70fb;
      }
    }
  }
  else {
    tr = 0x16;
    i = 0xc;
  }
  for (st = IRT_NIL; uVar1 = (ushort)tr, st < IRT_TRUE; st = st + IRT_FALSE) {
    uVar3 = sp[st] >> 0x18 & 0x1f;
    if ((uVar3 == 0xe) || (uVar3 == 0xd)) {
      TVar4 = sp[st];
      (J->fold).ins.field_0.ot = uVar1 | 0x5b00;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (ushort)uVar3 | (ushort)(tr << 5) | 0x1000;
      TVar4 = lj_opt_fold(J);
      sp[st] = TVar4;
    }
    else if ((uVar3 != 0x15) && (uVar3 != 0x16)) {
      TVar4 = sp[st];
      uVar6 = 0x800;
      if ((s[st]->info & 0x800000) != 0) {
        uVar6 = 0;
      }
      (J->fold).ins.field_0.ot = uVar1 | 0x5b00;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (ushort)(tr << 5) | 0x13 | uVar6;
      TVar4 = lj_opt_fold(J);
      sp[st] = TVar4;
    }
  }
  if (MM_call < mm) {
    TVar4 = *sp;
    TVar5 = sp[1];
    (J->fold).ins.field_0.ot = ((short)mm + 0x1f) * 0x100 | uVar1;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
    TVar4 = lj_opt_fold(J);
    TVar5 = lj_ir_kint(J,i);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar4 = lj_opt_fold(J);
    return TVar4;
  }
LAB_001b70fb:
  if (mm == MM_eq) {
    sVar2 = 8;
  }
  else {
    sVar2 = 2;
    if (mm == MM_lt) {
      sVar2 = 0;
    }
    if ((tr == 0x14) || (tr == 0x16)) {
      sVar2 = sVar2 + 4;
    }
  }
  TVar4 = *sp;
  TVar5 = sp[1];
  (J->fold).ins.field_0.ot = sVar2 << 8 | (ushort)tr | 0x80;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
  J->postproc = LJ_POST_FIXGUARD;
  return 0x2007ffd;
}

Assistant:

static TRef crec_arith_int64(jit_State *J, TRef *sp, CType **s, MMS mm)
{
  if (sp[0] && sp[1] && ctype_isnum(s[0]->info) && ctype_isnum(s[1]->info)) {
    IRType dt;
    CTypeID id;
    TRef tr;
    MSize i;
    IROp op;
    lj_needsplit(J);
    if (((s[0]->info & CTF_UNSIGNED) && s[0]->size == 8) ||
	((s[1]->info & CTF_UNSIGNED) && s[1]->size == 8)) {
      dt = IRT_U64; id = CTID_UINT64;
    } else {
      dt = IRT_I64; id = CTID_INT64;
      if (mm < MM_add &&
	  !((s[0]->info | s[1]->info) & CTF_FP) &&
	  s[0]->size == 4 && s[1]->size == 4) {  /* Try to narrow comparison. */
	if (!((s[0]->info ^ s[1]->info) & CTF_UNSIGNED) ||
	    (tref_isk(sp[1]) && IR(tref_ref(sp[1]))->i >= 0)) {
	  dt = (s[0]->info & CTF_UNSIGNED) ? IRT_U32 : IRT_INT;
	  goto comp;
	} else if (tref_isk(sp[0]) && IR(tref_ref(sp[0]))->i >= 0) {
	  dt = (s[1]->info & CTF_UNSIGNED) ? IRT_U32 : IRT_INT;
	  goto comp;
	}
      }
    }
    for (i = 0; i < 2; i++) {
      IRType st = tref_type(sp[i]);
      if (st == IRT_NUM || st == IRT_FLOAT)
	sp[i] = emitconv(sp[i], dt, st, IRCONV_ANY);
      else if (!(st == IRT_I64 || st == IRT_U64))
	sp[i] = emitconv(sp[i], dt, IRT_INT,
			 (s[i]->info & CTF_UNSIGNED) ? 0 : IRCONV_SEXT);
    }
    if (mm < MM_add) {
    comp:
      /* Assume true comparison. Fixup and emit pending guard later. */
      if (mm == MM_eq) {
	op = IR_EQ;
      } else {
	op = mm == MM_lt ? IR_LT : IR_LE;
	if (dt == IRT_U32 || dt == IRT_U64)
	  op += (IR_ULT-IR_LT);
      }
      lj_ir_set(J, IRTG(op, dt), sp[0], sp[1]);
      J->postproc = LJ_POST_FIXGUARD;
      return TREF_TRUE;
    } else {
      tr = emitir(IRT(mm+(int)IR_ADD-(int)MM_add, dt), sp[0], sp[1]);
    }
    return emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
  }
  return 0;
}